

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_fkhash_nlm<int,_32UL>::append_dummy(compact_fkhash_nlm<int,_32UL> *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vec;
  type_conflict *val;
  uint64_t in_RDI;
  compact_fkhash_nlm<int,_32UL> *unaff_retaddr;
  type_conflict *pos_in_chunk;
  type_conflict *chunk_id;
  
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  decompose_value<32ul>(in_RDI);
  vec = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
        std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x22334b);
  val = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x22335a);
  if (((vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0) && (*val == 0)) {
    release_buf_(unaff_retaddr);
  }
  vbyte::append(vec,(uint64_t)val);
  return;
}

Assistant:

void append_dummy() {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

        vbyte::append(chunk_buf_, 0);
    }